

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

void __thiscall EventHandler::OnPlayerJoin(EventHandler *this,IPlayer *player)

{
  CmdHandl *pCVar1;
  code *local_58;
  undefined8 uStack_50;
  code *local_48;
  code *pcStack_40;
  long *local_38 [2];
  long local_28 [2];
  
  pCVar1 = cmdh;
  local_38[0] = local_28;
  std::__cxx11::u16string::_M_construct<char16_t_const*>((u16string *)local_38,L"help",L"");
  uStack_50 = 0;
  local_58 = CmdList::help;
  pcStack_40 = std::
               _Function_handler<void_(rage::IPlayer_*,_std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_&),_void_(*)(rage::IPlayer_*,_std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_&)>
               ::_M_invoke;
  local_48 = std::
             _Function_handler<void_(rage::IPlayer_*,_std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_&),_void_(*)(rage::IPlayer_*,_std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_&)>
             ::_M_manager;
  (**pCVar1->_vptr_CmdHandl)(pCVar1,(u16string *)local_38);
  if (local_48 != (code *)0x0) {
    (*local_48)(&local_58,&local_58,3);
  }
  if (local_38[0] != local_28) {
    operator_delete(local_38[0],local_28[0] * 2 + 2);
  }
  return;
}

Assistant:

void EventHandler::OnPlayerJoin( rage::IPlayer *player)
{
	cmdh->addCommand(u"help", CmdList::help);
}